

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,RE *regex,char *file,int line,
          DeathTest **test)

{
  size_type *psVar1;
  InternalRunDeathTestFlag *pIVar2;
  undefined1 *puVar3;
  string *psVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  DeathTest *this_00;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  undefined8 uVar11;
  int death_test_index;
  int local_fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  string local_98;
  int local_74;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  UnitTest::GetInstance();
  pIVar2 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_).ptr_;
  iVar5 = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).death_test_count_;
  local_fc = iVar5 + 1;
  ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).death_test_count_ =
       local_fc;
  if (pIVar2 != (InternalRunDeathTestFlag *)0x0) {
    if (pIVar2->index_ <= iVar5) {
      StreamableToString<int>(&local_50,&local_fc);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x160da7);
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_60 = *plVar8;
        lStack_58 = plVar6[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar8;
        local_70 = (long *)*plVar6;
      }
      local_68 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
      puVar9 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar9) {
        local_a8 = *puVar9;
        lStack_a0 = plVar6[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *puVar9;
        local_b8 = (ulong *)*plVar6;
      }
      local_b0 = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_74 = pIVar2->index_;
      StreamableToString<int>(&local_98,&local_74);
      uVar10 = 0xf;
      if (local_b8 != &local_a8) {
        uVar10 = local_a8;
      }
      if (uVar10 < local_98._M_string_length + local_b0) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          uVar11 = local_98.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_98._M_string_length + local_b0) goto LAB_0014ffb5;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_b8);
      }
      else {
LAB_0014ffb5:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98._M_dataplus._M_p)
        ;
      }
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      psVar1 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_f8.field_2._M_allocated_capacity = *psVar1;
        local_f8.field_2._8_8_ = puVar7[3];
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar1;
        local_f8._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_f8._M_string_length = puVar7[1];
      *puVar7 = psVar1;
      puVar7[1] = 0;
      *(undefined1 *)psVar1 = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
      plVar6 = puVar7 + 2;
      if ((long *)*puVar7 == plVar6) {
        local_c8 = *plVar6;
        lStack_c0 = puVar7[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar6;
        local_d8 = (long *)*puVar7;
      }
      local_d0 = puVar7[1];
      *puVar7 = plVar6;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      psVar4 = &local_50;
      goto LAB_00150172;
    }
    iVar5 = std::__cxx11::string::compare((char *)pIVar2);
    if (((iVar5 != 0) || (pIVar2->line_ != line)) || (pIVar2->index_ != local_fc)) {
      *test = (DeathTest *)0x0;
      return true;
    }
  }
  iVar5 = std::__cxx11::string::compare(FLAGS_gtest_death_test_style_abi_cxx11_);
  if (iVar5 == 0) {
    this_00 = (DeathTest *)operator_new(0x40);
    DeathTest::DeathTest(this_00);
    this_00[1]._vptr_DeathTest = (_func_int **)statement;
    this_00[2]._vptr_DeathTest = (_func_int **)regex;
    *(undefined1 *)&this_00[3]._vptr_DeathTest = 0;
    *(undefined8 *)((long)&this_00[3]._vptr_DeathTest + 4) = 0xffffffff;
    *(undefined8 *)((long)&this_00[4]._vptr_DeathTest + 4) = 0xffffffffffffffff;
    *(undefined4 *)((long)&this_00[5]._vptr_DeathTest + 4) = 0xffffffff;
    this_00->_vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_00172a00;
    this_00[6]._vptr_DeathTest = (_func_int **)file;
    *(int *)&this_00[7]._vptr_DeathTest = line;
  }
  else {
    iVar5 = std::__cxx11::string::compare(FLAGS_gtest_death_test_style_abi_cxx11_);
    if (iVar5 != 0) {
      std::operator+(&local_f8,"Unknown death test style \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FLAGS_gtest_death_test_style_abi_cxx11_);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_c8 = *plVar8;
        lStack_c0 = plVar6[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar8;
        local_d8 = (long *)*plVar6;
      }
      local_d0 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      psVar4 = &local_f8;
LAB_00150172:
      puVar3 = (undefined1 *)(&(psVar4->field_2)._M_allocated_capacity)[-2];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar3 != &psVar4->field_2) {
        operator_delete(puVar3);
      }
      return false;
    }
    this_00 = (DeathTest *)operator_new(0x30);
    DeathTest::DeathTest(this_00);
    this_00[1]._vptr_DeathTest = (_func_int **)statement;
    this_00[2]._vptr_DeathTest = (_func_int **)regex;
    *(undefined1 *)&this_00[3]._vptr_DeathTest = 0;
    *(undefined8 *)((long)&this_00[3]._vptr_DeathTest + 4) = 0xffffffff;
    *(undefined8 *)((long)&this_00[4]._vptr_DeathTest + 4) = 0xffffffffffffffff;
    *(undefined4 *)((long)&this_00[5]._vptr_DeathTest + 4) = 0xffffffff;
    this_00->_vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_001729a8;
  }
  *test = this_00;
  return true;
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement, const RE* regex,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index = impl->current_test_info()
      ->increment_death_test_count();

  if (flag != NULL) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(
          "Death test count (" + StreamableToString(death_test_index)
          + ") somehow exceeded expected maximum ("
          + StreamableToString(flag->index()) + ")");
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = NULL;
      return true;
    }
  }

# if GTEST_OS_WINDOWS

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, regex, file, line);
  }

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, regex, file, line);
  } else if (GTEST_FLAG(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, regex);
  }

# endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message(
        "Unknown death test style \"" + GTEST_FLAG(death_test_style)
        + "\" encountered");
    return false;
  }